

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_aws_sigv4.c
# Opt level: O2

CURLcode Curl_output_aws_sigv4(Curl_easy *data,_Bool proxy)

{
  undefined1 *puVar1;
  byte *pbVar2;
  connectdata *conn;
  curl_trc_feat *pcVar3;
  Curl_easy *pCVar4;
  char cVar5;
  int iVar6;
  uint uVar7;
  CURLcode CVar8;
  char *pcVar9;
  size_t sVar10;
  time_t intime;
  char *pcVar11;
  curl_slist *pcVar12;
  curl_slist *pcVar13;
  byte *pbVar14;
  byte *pbVar15;
  char *pcVar16;
  char *pcVar17;
  char *pcVar18;
  uchar *input;
  size_t sVar19;
  uchar *data_00;
  uchar *data_01;
  uchar *key;
  byte bVar20;
  uint uVar21;
  char *tmp;
  char *pcVar22;
  uint uVar23;
  curl_slist *l;
  char *pcVar24;
  curl_slist **ppcVar25;
  size_t sVar26;
  long lVar27;
  size_t *psVar28;
  ulong uVar29;
  curl_slist *pcVar30;
  pair *__base;
  bool bVar31;
  bool bVar32;
  CURLcode local_844;
  byte *local_840;
  curl_slist *local_838;
  _Bool local_829;
  Curl_easy *local_828;
  char *local_820;
  uchar *local_818;
  CURLcode local_80c;
  char *local_808;
  uint local_800;
  Curl_HttpReq httpreq;
  char timestamp [17];
  char *method;
  uchar sign0 [32];
  char service [65];
  uchar sign1 [32];
  char region [65];
  char provider0 [65];
  char provider1 [65];
  dynbuf canonical_query;
  dynbuf signed_headers;
  uchar sha_hash [32];
  dynbuf canonical_path;
  dynbuf canonical_headers;
  char sha_hex [65];
  char date_hdr_key [72];
  char content_sha256_hdr [151];
  tm tm;
  pair array [64];
  
  conn = data->conn;
  provider0[0x40] = '\0';
  provider0[0x30] = '\0';
  provider0[0x31] = '\0';
  provider0[0x32] = '\0';
  provider0[0x33] = '\0';
  provider0[0x34] = '\0';
  provider0[0x35] = '\0';
  provider0[0x36] = '\0';
  provider0[0x37] = '\0';
  provider0[0x38] = '\0';
  provider0[0x39] = '\0';
  provider0[0x3a] = '\0';
  provider0[0x3b] = '\0';
  provider0[0x3c] = '\0';
  provider0[0x3d] = '\0';
  provider0[0x3e] = '\0';
  provider0[0x3f] = '\0';
  provider0[0x20] = '\0';
  provider0[0x21] = '\0';
  provider0[0x22] = '\0';
  provider0[0x23] = '\0';
  provider0[0x24] = '\0';
  provider0[0x25] = '\0';
  provider0[0x26] = '\0';
  provider0[0x27] = '\0';
  provider0[0x28] = '\0';
  provider0[0x29] = '\0';
  provider0[0x2a] = '\0';
  provider0[0x2b] = '\0';
  provider0[0x2c] = '\0';
  provider0[0x2d] = '\0';
  provider0[0x2e] = '\0';
  provider0[0x2f] = '\0';
  provider0[0x10] = '\0';
  provider0[0x11] = '\0';
  provider0[0x12] = '\0';
  provider0[0x13] = '\0';
  provider0[0x14] = '\0';
  provider0[0x15] = '\0';
  provider0[0x16] = '\0';
  provider0[0x17] = '\0';
  provider0[0x18] = '\0';
  provider0[0x19] = '\0';
  provider0[0x1a] = '\0';
  provider0[0x1b] = '\0';
  provider0[0x1c] = '\0';
  provider0[0x1d] = '\0';
  provider0[0x1e] = '\0';
  provider0[0x1f] = '\0';
  provider0[0] = '\0';
  provider0[1] = '\0';
  provider0[2] = '\0';
  provider0[3] = '\0';
  provider0[4] = '\0';
  provider0[5] = '\0';
  provider0[6] = '\0';
  provider0[7] = '\0';
  provider0[8] = '\0';
  provider0[9] = '\0';
  provider0[10] = '\0';
  provider0[0xb] = '\0';
  provider0[0xc] = '\0';
  provider0[0xd] = '\0';
  provider0[0xe] = '\0';
  provider0[0xf] = '\0';
  provider1[0x40] = '\0';
  provider1[0x30] = '\0';
  provider1[0x31] = '\0';
  provider1[0x32] = '\0';
  provider1[0x33] = '\0';
  provider1[0x34] = '\0';
  provider1[0x35] = '\0';
  provider1[0x36] = '\0';
  provider1[0x37] = '\0';
  provider1[0x38] = '\0';
  provider1[0x39] = '\0';
  provider1[0x3a] = '\0';
  provider1[0x3b] = '\0';
  provider1[0x3c] = '\0';
  provider1[0x3d] = '\0';
  provider1[0x3e] = '\0';
  provider1[0x3f] = '\0';
  provider1[0x20] = '\0';
  provider1[0x21] = '\0';
  provider1[0x22] = '\0';
  provider1[0x23] = '\0';
  provider1[0x24] = '\0';
  provider1[0x25] = '\0';
  provider1[0x26] = '\0';
  provider1[0x27] = '\0';
  provider1[0x28] = '\0';
  provider1[0x29] = '\0';
  provider1[0x2a] = '\0';
  provider1[0x2b] = '\0';
  provider1[0x2c] = '\0';
  provider1[0x2d] = '\0';
  provider1[0x2e] = '\0';
  provider1[0x2f] = '\0';
  provider1[0x10] = '\0';
  provider1[0x11] = '\0';
  provider1[0x12] = '\0';
  provider1[0x13] = '\0';
  provider1[0x14] = '\0';
  provider1[0x15] = '\0';
  provider1[0x16] = '\0';
  provider1[0x17] = '\0';
  provider1[0x18] = '\0';
  provider1[0x19] = '\0';
  provider1[0x1a] = '\0';
  provider1[0x1b] = '\0';
  provider1[0x1c] = '\0';
  provider1[0x1d] = '\0';
  provider1[0x1e] = '\0';
  provider1[0x1f] = '\0';
  provider1[0] = '\0';
  provider1[1] = '\0';
  provider1[2] = '\0';
  provider1[3] = '\0';
  provider1[4] = '\0';
  provider1[5] = '\0';
  provider1[6] = '\0';
  provider1[7] = '\0';
  provider1[8] = '\0';
  provider1[9] = '\0';
  provider1[10] = '\0';
  provider1[0xb] = '\0';
  provider1[0xc] = '\0';
  provider1[0xd] = '\0';
  provider1[0xe] = '\0';
  provider1[0xf] = '\0';
  region[0x40] = '\0';
  region[0x30] = '\0';
  region[0x31] = '\0';
  region[0x32] = '\0';
  region[0x33] = '\0';
  region[0x34] = '\0';
  region[0x35] = '\0';
  region[0x36] = '\0';
  region[0x37] = '\0';
  region[0x38] = '\0';
  region[0x39] = '\0';
  region[0x3a] = '\0';
  region[0x3b] = '\0';
  region[0x3c] = '\0';
  region[0x3d] = '\0';
  region[0x3e] = '\0';
  region[0x3f] = '\0';
  region[0x20] = '\0';
  region[0x21] = '\0';
  region[0x22] = '\0';
  region[0x23] = '\0';
  region[0x24] = '\0';
  region[0x25] = '\0';
  region[0x26] = '\0';
  region[0x27] = '\0';
  region[0x28] = '\0';
  region[0x29] = '\0';
  region[0x2a] = '\0';
  region[0x2b] = '\0';
  region[0x2c] = '\0';
  region[0x2d] = '\0';
  region[0x2e] = '\0';
  region[0x2f] = '\0';
  region[0x10] = '\0';
  region[0x11] = '\0';
  region[0x12] = '\0';
  region[0x13] = '\0';
  region[0x14] = '\0';
  region[0x15] = '\0';
  region[0x16] = '\0';
  region[0x17] = '\0';
  region[0x18] = '\0';
  region[0x19] = '\0';
  region[0x1a] = '\0';
  region[0x1b] = '\0';
  region[0x1c] = '\0';
  region[0x1d] = '\0';
  region[0x1e] = '\0';
  region[0x1f] = '\0';
  region[0] = '\0';
  region[1] = '\0';
  region[2] = '\0';
  region[3] = '\0';
  region[4] = '\0';
  region[5] = '\0';
  region[6] = '\0';
  region[7] = '\0';
  region[8] = '\0';
  region[9] = '\0';
  region[10] = '\0';
  region[0xb] = '\0';
  region[0xc] = '\0';
  region[0xd] = '\0';
  region[0xe] = '\0';
  region[0xf] = '\0';
  service[0x40] = '\0';
  service[0x30] = '\0';
  service[0x31] = '\0';
  service[0x32] = '\0';
  service[0x33] = '\0';
  service[0x34] = '\0';
  service[0x35] = '\0';
  service[0x36] = '\0';
  service[0x37] = '\0';
  service[0x38] = '\0';
  service[0x39] = '\0';
  service[0x3a] = '\0';
  service[0x3b] = '\0';
  service[0x3c] = '\0';
  service[0x3d] = '\0';
  service[0x3e] = '\0';
  service[0x3f] = '\0';
  service[0x20] = '\0';
  service[0x21] = '\0';
  service[0x22] = '\0';
  service[0x23] = '\0';
  service[0x24] = '\0';
  service[0x25] = '\0';
  service[0x26] = '\0';
  service[0x27] = '\0';
  service[0x28] = '\0';
  service[0x29] = '\0';
  service[0x2a] = '\0';
  service[0x2b] = '\0';
  service[0x2c] = '\0';
  service[0x2d] = '\0';
  service[0x2e] = '\0';
  service[0x2f] = '\0';
  service[0x10] = '\0';
  service[0x11] = '\0';
  service[0x12] = '\0';
  service[0x13] = '\0';
  service[0x14] = '\0';
  service[0x15] = '\0';
  service[0x16] = '\0';
  service[0x17] = '\0';
  service[0x18] = '\0';
  service[0x19] = '\0';
  service[0x1a] = '\0';
  service[0x1b] = '\0';
  service[0x1c] = '\0';
  service[0x1d] = '\0';
  service[0x1e] = '\0';
  service[0x1f] = '\0';
  service[0] = '\0';
  service[1] = '\0';
  service[2] = '\0';
  service[3] = '\0';
  service[4] = '\0';
  service[5] = '\0';
  service[6] = '\0';
  service[7] = '\0';
  service[8] = '\0';
  service[9] = '\0';
  service[10] = '\0';
  service[0xb] = '\0';
  service[0xc] = '\0';
  service[0xd] = '\0';
  service[0xe] = '\0';
  service[0xf] = '\0';
  pcVar16 = (conn->host).name;
  method = (char *)0x0;
  memset(content_sha256_hdr,0,0x97);
  pcVar24 = (data->state).aptr.user;
  if (pcVar24 == (char *)0x0) {
    pcVar24 = "";
  }
  sign0[0x10] = '\0';
  sign0[0x11] = '\0';
  sign0[0x12] = '\0';
  sign0[0x13] = '\0';
  sign0[0x14] = '\0';
  sign0[0x15] = '\0';
  sign0[0x16] = '\0';
  sign0[0x17] = '\0';
  sign0[0x18] = '\0';
  sign0[0x19] = '\0';
  sign0[0x1a] = '\0';
  sign0[0x1b] = '\0';
  sign0[0x1c] = '\0';
  sign0[0x1d] = '\0';
  sign0[0x1e] = '\0';
  sign0[0x1f] = '\0';
  sign0[0] = '\0';
  sign0[1] = '\0';
  sign0[2] = '\0';
  sign0[3] = '\0';
  sign0[4] = '\0';
  sign0[5] = '\0';
  sign0[6] = '\0';
  sign0[7] = '\0';
  sign0[8] = '\0';
  sign0[9] = '\0';
  sign0[10] = '\0';
  sign0[0xb] = '\0';
  sign0[0xc] = '\0';
  sign0[0xd] = '\0';
  sign0[0xe] = '\0';
  sign0[0xf] = '\0';
  sign1[0x10] = '\0';
  sign1[0x11] = '\0';
  sign1[0x12] = '\0';
  sign1[0x13] = '\0';
  sign1[0x14] = '\0';
  sign1[0x15] = '\0';
  sign1[0x16] = '\0';
  sign1[0x17] = '\0';
  sign1[0x18] = '\0';
  sign1[0x19] = '\0';
  sign1[0x1a] = '\0';
  sign1[0x1b] = '\0';
  sign1[0x1c] = '\0';
  sign1[0x1d] = '\0';
  sign1[0x1e] = '\0';
  sign1[0x1f] = '\0';
  sign1[0] = '\0';
  sign1[1] = '\0';
  sign1[2] = '\0';
  sign1[3] = '\0';
  sign1[4] = '\0';
  sign1[5] = '\0';
  sign1[6] = '\0';
  sign1[7] = '\0';
  sign1[8] = '\0';
  sign1[9] = '\0';
  sign1[10] = '\0';
  sign1[0xb] = '\0';
  sign1[0xc] = '\0';
  sign1[0xd] = '\0';
  sign1[0xe] = '\0';
  sign1[0xf] = '\0';
  pcVar9 = Curl_checkheaders(data,"Authorization",0xd);
  if (pcVar9 != (char *)0x0) {
    return CURLE_OK;
  }
  Curl_dyn_init(&canonical_headers,0x19000);
  Curl_dyn_init(&canonical_query,0x19000);
  Curl_dyn_init(&signed_headers,0x19000);
  Curl_dyn_init(&canonical_path,0x19000);
  pcVar9 = (data->set).str[0x44];
  pcVar11 = "aws:amz";
  if (pcVar9 != (char *)0x0) {
    pcVar11 = pcVar9;
  }
  __isoc99_sscanf(pcVar11,"%64[^:]:%64[^:]:%64[^:]:%64s",provider0,provider1,region,service);
  if (provider0[0] == '\0') {
    Curl_failf(data,"first aws-sigv4 provider cannot be empty");
    local_844 = CURLE_BAD_FUNCTION_ARGUMENT;
    goto LAB_00135fb6;
  }
  if (provider1[0] == '\0') {
    strcpy(provider1,provider0);
  }
  local_828 = data;
  if (service[0] != '\0') goto LAB_00135b9c;
  pcVar9 = strchr(pcVar16,0x2e);
  if (pcVar9 == (char *)0x0) {
    pcVar16 = "aws-sigv4: service missing in parameters and hostname";
LAB_00135d3e:
    Curl_failf(data,pcVar16);
    local_844 = CURLE_URL_MALFORMAT;
LAB_00135fb6:
    local_840 = (byte *)0x0;
    goto LAB_00135fbc;
  }
  uVar29 = (long)pcVar9 - (long)pcVar16;
  if (0x40 < uVar29) {
    pcVar16 = "aws-sigv4: service too long in hostname";
    data = local_828;
    goto LAB_00135d3e;
  }
  memcpy(service,pcVar16,uVar29);
  data = local_828;
  service[uVar29] = '\0';
  if ((((local_828->set).field_0x8cd & 0x10) != 0) &&
     ((pcVar3 = (local_828->state).feat, pcVar3 == (curl_trc_feat *)0x0 || (0 < pcVar3->log_level)))
     ) {
    Curl_infof(local_828,"aws_sigv4: picked service %s from host",service);
  }
  if (region[0] == '\0') {
    pcVar9 = pcVar9 + 1;
    pcVar11 = strchr(pcVar9,0x2e);
    data = local_828;
    if (pcVar11 == (char *)0x0) {
      pcVar16 = "aws-sigv4: region missing in parameters and hostname";
    }
    else {
      uVar29 = (long)pcVar11 - (long)pcVar9;
      if (uVar29 < 0x41) {
        memcpy(region,pcVar9,uVar29);
        data = local_828;
        region[uVar29] = '\0';
        if ((((local_828->set).field_0x8cd & 0x10) != 0) &&
           ((pcVar3 = (local_828->state).feat, pcVar3 == (curl_trc_feat *)0x0 ||
            (0 < pcVar3->log_level)))) {
          Curl_infof(local_828,"aws_sigv4: picked region %s from host",region);
        }
        goto LAB_00135b9c;
      }
      pcVar16 = "aws-sigv4: region too long in hostname";
    }
    goto LAB_00135d3e;
  }
LAB_00135b9c:
  Curl_http_method(data,conn,&method,&httpreq);
  iVar6 = curl_strequal(provider0,"aws");
  if (iVar6 == 0) {
    bVar31 = false;
  }
  else {
    iVar6 = curl_strequal(service,"s3");
    bVar31 = iVar6 != 0;
  }
  iVar6 = curl_msnprintf((char *)array,0x52,"x-%s-content-sha256",provider1);
  pcVar9 = Curl_checkheaders(data,(char *)array,(long)iVar6);
  if ((pcVar9 == (char *)0x0) || (pcVar9 = strchr(pcVar9,0x3a), pcVar9 == (char *)0x0)) {
    if (bVar31) {
      bVar31 = true;
      if ((httpreq != HTTPREQ_GET) && (httpreq != HTTPREQ_HEAD)) {
        bVar31 = (data->set).filesize == 0;
      }
      if (httpreq == HTTPREQ_POST) {
        bVar32 = (data->set).postfields != (void *)0x0;
      }
      else {
        bVar32 = false;
      }
      if ((bool)(bVar31 | bVar32)) {
        local_844 = calc_payload_hash(data,sha_hash,sha_hex);
        if (local_844 != CURLE_OK) goto LAB_00135fb6;
      }
      else {
        builtin_strncpy(sha_hex,"UNSIGNED-PAYLOAD",0x11);
      }
      curl_msnprintf(content_sha256_hdr,0x95,"x-%s-content-sha256: %s",provider1,sha_hex);
LAB_00135e57:
      pcVar9 = sha_hex;
      sVar19 = strlen(pcVar9);
      goto LAB_00135e6a;
    }
    local_844 = calc_payload_hash(data,sha_hash,sha_hex);
    if (local_844 == CURLE_OK) goto LAB_00135e57;
    goto LAB_00135fb6;
  }
  do {
    do {
      pcVar11 = pcVar9;
      pcVar9 = pcVar11 + 1;
    } while (*pcVar9 == ' ');
  } while (*pcVar9 == '\t');
  sVar10 = strlen(pcVar9);
  do {
    sVar19 = sVar10;
    if (sVar19 == 0) break;
    cVar5 = pcVar11[sVar19];
    sVar10 = sVar19 - 1;
  } while ((cVar5 == ' ') || (cVar5 == '\t'));
LAB_00135e6a:
  intime = time((time_t *)0x0);
  local_844 = Curl_gmtime(intime,&tm);
  if (local_844 != CURLE_OK) {
    data_00 = (uchar *)0x0;
    data_01 = (uchar *)0x0;
    key = (uchar *)0x0;
    local_840 = (byte *)0x0;
    pcVar16 = (char *)0x0;
    input = (uchar *)0x0;
    goto LAB_00135fc4;
  }
  sVar10 = strftime(timestamp,0x11,"%Y%m%dT%H%M%SZ",(tm *)&tm);
  local_844 = CURLE_OUT_OF_MEMORY;
  if (sVar10 == 0) goto LAB_00135fb6;
  sVar10 = strlen(provider1);
  Curl_strntolower(provider1,provider1,sVar10);
  cVar5 = Curl_raw_toupper(provider1[0]);
  provider1[0] = cVar5;
  local_838 = (curl_slist *)0x0;
  curl_msnprintf(date_hdr_key,0x48,"X-%s-Date",provider1);
  Curl_strntolower(provider1,provider1,1);
  curl_msnprintf((char *)array,0x5a,"x-%s-date:%s",provider1,timestamp);
  pcVar11 = Curl_checkheaders(data,"Host",4);
  if (pcVar11 == (char *)0x0) {
    pcVar11 = (data->state).aptr.host;
    if (pcVar11 == (char *)0x0) {
      pcVar16 = curl_maprintf("host:%s",pcVar16);
    }
    else {
      sVar10 = strcspn(pcVar11,"\n\r");
      pcVar16 = (char *)Curl_memdup0(pcVar11,sVar10);
    }
    if ((pcVar16 != (char *)0x0) &&
       (local_838 = Curl_slist_append_nodup((curl_slist *)0x0,pcVar16),
       local_838 != (curl_slist *)0x0)) goto LAB_00135f78;
    (*Curl_cfree)(pcVar16);
    local_80c = CURLE_OUT_OF_MEMORY;
    local_840 = (byte *)0x0;
    bVar31 = false;
    local_838 = (curl_slist *)0x0;
  }
  else {
LAB_00135f78:
    pcVar12 = local_838;
    if ((content_sha256_hdr[0] == '\0') ||
       (pcVar12 = curl_slist_append(local_838,content_sha256_hdr), pcVar12 != (curl_slist *)0x0)) {
      local_80c = CURLE_OUT_OF_MEMORY;
      ppcVar25 = &(data->set).headers;
      local_838 = pcVar12;
      while (pcVar12 = *ppcVar25, pcVar13 = local_838, pcVar12 != (curl_slist *)0x0) {
        pcVar16 = pcVar12->data;
        pcVar11 = strchr(pcVar16,0x3a);
        if (((pcVar11 != (char *)0x0) || (pcVar11 = strchr(pcVar16,0x3b), pcVar11 != (char *)0x0))
           && ((*pcVar11 != ':' || (pcVar11[1] != '\0')))) {
          lVar27 = 0;
          while (((cVar5 = pcVar11[lVar27 + 1], cVar5 == '\t' || (cVar5 == ' ')) ||
                 ((byte)(cVar5 - 10U) < 4))) {
            lVar27 = lVar27 + 1;
          }
          if ((lVar27 == 0) || (cVar5 != '\0')) {
            pcVar16 = (*Curl_cstrdup)(pcVar16);
            if (pcVar16 != (char *)0x0) {
              pcVar16[(long)pcVar11 - (long)pcVar12->data] = ':';
              pcVar13 = Curl_slist_append_nodup(local_838,pcVar16);
              if (pcVar13 != (curl_slist *)0x0) goto LAB_00136129;
              (*Curl_cfree)(pcVar16);
            }
            local_840 = (byte *)0x0;
            bVar31 = false;
            data = local_828;
            goto LAB_00136555;
          }
        }
LAB_00136129:
        data = local_828;
        local_838 = pcVar13;
        ppcVar25 = &pcVar12->next;
      }
      for (; pcVar13 != (curl_slist *)0x0; pcVar13 = pcVar13->next) {
        pcVar16 = pcVar13->data;
        sVar10 = strcspn(pcVar16,":");
        Curl_strntolower(pcVar16,pcVar16,sVar10);
        if (pcVar13->data[sVar10] != '\0') {
          pcVar11 = pcVar13->data + sVar10 + 1;
          for (pcVar16 = pcVar11; (cVar5 = *pcVar16, cVar5 == '\t' || (cVar5 == ' '));
              pcVar16 = pcVar16 + 1) {
          }
LAB_00136199:
          if (cVar5 != '\0') {
            iVar6 = 0;
            pcVar17 = pcVar16;
            while ((pcVar16 = pcVar17 + 1, cVar5 == ' ' || (cVar5 == '\t'))) {
              iVar6 = iVar6 + -1;
              pcVar17 = pcVar16;
              cVar5 = *pcVar16;
            }
            if (iVar6 != 0) goto code_r0x001361bf;
            goto LAB_001361d1;
          }
          *pcVar11 = '\0';
        }
        data = local_828;
      }
      sVar10 = strlen(date_hdr_key);
      pcVar16 = Curl_checkheaders(data,date_hdr_key,sVar10);
      if ((pcVar16 == (char *)0x0) &&
         (pcVar16 = Curl_checkheaders(data,"Date",4), pcVar16 == (char *)0x0)) {
        pcVar12 = curl_slist_append(local_838,(char *)array);
        if (pcVar12 != (curl_slist *)0x0) {
          local_808 = pcVar9;
          pbVar14 = (byte *)curl_maprintf("%s: %s\r\n",date_hdr_key,timestamp);
          local_840 = pbVar14;
LAB_00136399:
          pcVar13 = pcVar12;
          uVar23 = 0;
          do {
            while( true ) {
              local_800 = uVar23;
              pcVar30 = pcVar13;
              bVar31 = pcVar30 != (curl_slist *)0x0;
              pbVar14 = (byte *)CONCAT71((int7)((ulong)pbVar14 >> 8),bVar31);
              if (pcVar30 == (curl_slist *)0x0) break;
              local_818 = (uchar *)CONCAT71(local_818._1_7_,bVar31);
              pcVar13 = pcVar30->next;
              uVar23 = local_800;
              if (pcVar13 != (curl_slist *)0x0) {
                pcVar16 = pcVar30->data;
                pcVar9 = pcVar13->data;
                pcVar11 = strchr(pcVar16,0x3a);
                local_820 = pcVar9;
                pcVar9 = strchr(pcVar9,0x3a);
                if (pcVar11 == (char *)0x0) {
                  sVar10 = strlen(pcVar16);
                }
                else {
                  sVar10 = (long)pcVar11 - (long)pcVar16;
                }
                if (pcVar9 == (char *)0x0) {
                  sVar26 = strlen(local_820);
                }
                else {
                  sVar26 = (long)pcVar9 - (long)local_820;
                }
                pcVar9 = local_820;
                uVar29 = sVar26;
                if (sVar10 < sVar26) {
                  uVar29 = sVar10;
                }
                uVar7 = strncmp(pcVar16,local_820,uVar29);
                pbVar14 = (byte *)(ulong)uVar7;
                uVar21 = (int)sVar10 - (int)sVar26;
                if (uVar7 != 0) {
                  uVar21 = uVar7;
                }
                uVar23 = local_800;
                if (0 < (int)uVar21) {
                  pcVar30->data = pcVar9;
                  pcVar13->data = pcVar16;
                  uVar23 = CONCAT31((int3)(uVar7 >> 8),local_818._0_1_);
                  pbVar14 = (byte *)(ulong)uVar23;
                }
              }
            }
            pcVar13 = pcVar12;
            uVar23 = (uint)pbVar14;
          } while ((local_800 & 1) != 0);
          for (; bVar31 = pcVar13 == (curl_slist *)0x0, local_838 = pcVar12, !bVar31;
              pcVar13 = pcVar13->next) {
            CVar8 = Curl_dyn_add(&canonical_headers,pcVar13->data);
            pcVar9 = local_808;
            data = local_828;
            if ((CVar8 != CURLE_OK) ||
               (CVar8 = Curl_dyn_add(&canonical_headers,"\n"), pcVar9 = local_808, data = local_828,
               CVar8 != CURLE_OK)) goto LAB_00136555;
            pcVar16 = strchr(pcVar13->data,0x3a);
            if (pcVar16 != (char *)0x0) {
              *pcVar16 = '\0';
            }
            if (((pcVar13 != pcVar12) &&
                (CVar8 = Curl_dyn_add(&signed_headers,";"), pcVar9 = local_808, data = local_828,
                CVar8 != CURLE_OK)) ||
               (CVar8 = Curl_dyn_add(&signed_headers,pcVar13->data), pcVar9 = local_808,
               data = local_828, CVar8 != CURLE_OK)) goto LAB_00136555;
          }
          local_80c = CURLE_OK;
          pcVar9 = local_808;
          data = local_828;
          goto LAB_00136555;
        }
      }
      else {
        pbVar14 = (byte *)strchr(pcVar16,0x3a);
        if (pbVar14 != (byte *)0x0) {
          do {
            do {
              pbVar15 = pbVar14;
              pbVar14 = pbVar15 + 1;
              bVar20 = *pbVar14;
            } while (bVar20 == 9);
          } while (bVar20 == 0x20);
          lVar27 = 2;
          while ((bVar20 != 0 &&
                 (((byte)(bVar20 - 0x30) < 10 || ((byte)((bVar20 & 0xdf) + 0xbf) < 0x1a))))) {
            pbVar2 = pbVar15 + lVar27;
            lVar27 = lVar27 + 1;
            bVar20 = *pbVar2;
          }
          if (lVar27 == 0x12) {
            timestamp._0_8_ = *(undefined8 *)pbVar14;
            timestamp._8_8_ = *(undefined8 *)(pbVar15 + 9);
            timestamp[0x10] = '\0';
          }
          else {
            timestamp._0_8_ = timestamp._0_8_ & 0xffffffffffffff00;
          }
          local_840 = (byte *)0x0;
          pcVar12 = local_838;
          local_808 = pcVar9;
          goto LAB_00136399;
        }
      }
    }
    else {
      local_80c = CURLE_OUT_OF_MEMORY;
    }
    local_840 = (byte *)0x0;
    bVar31 = false;
  }
LAB_00136555:
  curl_slist_free_all(local_838);
  CVar8 = local_80c;
  if (!bVar31) {
LAB_00136894:
    data_01 = (uchar *)0x0;
    key = (uchar *)0x0;
    data_00 = (uchar *)0x0;
    pcVar16 = (char *)0x0;
    input = (uchar *)0x0;
    local_844 = CVar8;
    goto LAB_00135fc4;
  }
  if (content_sha256_hdr[0] != '\0') {
    sVar10 = strlen(content_sha256_hdr);
    (content_sha256_hdr + sVar10)[0] = '\r';
    (content_sha256_hdr + sVar10)[1] = '\n';
    content_sha256_hdr[sVar10 + 2] = '\0';
  }
  date_hdr_key[0] = timestamp[0];
  date_hdr_key[1] = timestamp[1];
  date_hdr_key[2] = timestamp[2];
  date_hdr_key[3] = timestamp[3];
  date_hdr_key[4] = timestamp[4];
  date_hdr_key[5] = timestamp[5];
  date_hdr_key[6] = timestamp[6];
  date_hdr_key[7] = timestamp[7];
  date_hdr_key[8] = '\0';
  pcVar16 = (data->state).up.query;
  if (pcVar16 != (char *)0x0) {
    psVar28 = &array[0].len;
    lVar27 = 0;
LAB_001365c3:
    ((pair *)(psVar28 + -1))->p = pcVar16;
    pcVar11 = strchr(pcVar16,0x26);
    if (pcVar11 != (char *)0x0) goto code_r0x001365d6;
    sVar10 = strlen(pcVar16);
    *psVar28 = sVar10;
    uVar23 = (uint)lVar27;
    if (uVar23 != 0x3f) {
      __base = array;
      qsort(__base,lVar27 + 1,0x10,compare_func);
      CVar8 = CURLE_OK;
      for (uVar21 = 0; (CVar8 == CURLE_OK && (uVar21 <= uVar23)); uVar21 = uVar21 + 1) {
        local_829 = false;
        CVar8 = CURLE_OK;
        if (((__base->len != 0) &&
            (CVar8 = canon_string(__base->p,__base->len,&canonical_query,&local_829),
            CVar8 == CURLE_OK)) &&
           (((local_829 != false ||
             (CVar8 = Curl_dyn_addn(&canonical_query,"=",1), CVar8 == CURLE_OK)) &&
            (CVar8 = CURLE_OK, uVar21 < uVar23)))) {
          CVar8 = Curl_dyn_addn(&canonical_query,"&",1);
        }
        __base = __base + 1;
      }
      if (CVar8 == CURLE_OK) goto LAB_00136615;
      goto LAB_00136894;
    }
    goto LAB_00136662;
  }
LAB_00136615:
  pcVar16 = (local_828->state).up.path;
  sVar10 = strlen(pcVar16);
  CVar8 = canon_string(pcVar16,sVar10,&canonical_path,(_Bool *)0x0);
  pcVar16 = method;
  if (CVar8 != CURLE_OK) goto LAB_00136894;
  pcVar11 = Curl_dyn_ptr(&canonical_path);
  pcVar17 = Curl_dyn_ptr(&canonical_query);
  pcVar22 = "";
  if (pcVar17 != (char *)0x0) {
    pcVar22 = Curl_dyn_ptr(&canonical_query);
  }
  pcVar17 = Curl_dyn_ptr(&canonical_headers);
  pcVar18 = Curl_dyn_ptr(&signed_headers);
  input = (uchar *)curl_maprintf("%s\n%s\n%s\n%s\n%s\n%.*s",pcVar16,pcVar11,pcVar22,pcVar17,pcVar18,
                                 sVar19,pcVar9);
  if (input == (uchar *)0x0) goto LAB_00135fbc;
  sVar19 = strlen(provider0);
  Curl_strntolower(provider0,provider0,sVar19);
  data_00 = (uchar *)curl_maprintf("%s4_request",provider0);
  if (data_00 != (uchar *)0x0) {
    pcVar16 = curl_maprintf("%s/%s/%s/%s",date_hdr_key,region,service,data_00);
    if (pcVar16 == (char *)0x0) {
      key = (uchar *)0x0;
      data_01 = (uchar *)0x0;
      pcVar16 = (char *)0x0;
      goto LAB_00135fc4;
    }
    local_820 = pcVar16;
    sVar19 = strlen((char *)input);
    CVar8 = Curl_sha256it(sha_hash,input,sVar19);
    if (CVar8 == CURLE_OK) {
      sha256_to_hex(sha_hex,sha_hash);
      sVar19 = strlen(provider0);
      Curl_strntoupper(provider0,provider0,sVar19);
      data_01 = (uchar *)curl_maprintf("%s4-HMAC-SHA256\n%s\n%s\n%s",provider0,timestamp,local_820,
                                       sha_hex);
      if (data_01 == (uchar *)0x0) goto LAB_001367bf;
      pcVar16 = (local_828->state).aptr.passwd;
      if (pcVar16 == (char *)0x0) {
        pcVar16 = "";
      }
      local_818 = input;
      key = (uchar *)curl_maprintf("%s4%s",provider0,pcVar16);
      input = local_818;
      if (key != (uchar *)0x0) {
        sVar19 = strlen((char *)key);
        sVar10 = strlen(date_hdr_key);
        local_844 = Curl_hmacit(Curl_HMAC_SHA256,key,sVar19,(uchar *)date_hdr_key,sVar10,sign0);
        pcVar16 = local_820;
        input = local_818;
        if (local_844 == CURLE_OK) {
          sVar19 = strlen(region);
          local_844 = Curl_hmacit(Curl_HMAC_SHA256,sign0,0x20,(uchar *)region,sVar19,sign1);
          pcVar16 = local_820;
          input = local_818;
          if (local_844 == CURLE_OK) {
            sVar19 = strlen(service);
            local_844 = Curl_hmacit(Curl_HMAC_SHA256,sign1,0x20,(uchar *)service,sVar19,sign0);
            pcVar16 = local_820;
            input = local_818;
            if (local_844 == CURLE_OK) {
              sVar19 = strlen((char *)data_00);
              local_844 = Curl_hmacit(Curl_HMAC_SHA256,sign0,0x20,data_00,sVar19,sign1);
              pcVar16 = local_820;
              input = local_818;
              if (local_844 == CURLE_OK) {
                sVar19 = strlen((char *)data_01);
                local_844 = Curl_hmacit(Curl_HMAC_SHA256,sign1,0x20,data_01,sVar19,sign0);
                pcVar16 = local_820;
                input = local_818;
                if (local_844 == CURLE_OK) {
                  sha256_to_hex(sha_hex,sign0);
                  pcVar16 = Curl_dyn_ptr(&signed_headers);
                  pbVar14 = (byte *)0x17889b;
                  if (local_840 != (byte *)0x0) {
                    pbVar14 = local_840;
                  }
                  local_844 = CURLE_OK;
                  pcVar24 = curl_maprintf("Authorization: %s4-HMAC-SHA256 Credential=%s/%s, SignedHeaders=%s, Signature=%s\r\n%s%s"
                                          ,provider0,pcVar24,local_820,pcVar16,sha_hex,pbVar14,
                                          content_sha256_hdr);
                  pCVar4 = local_828;
                  pcVar16 = local_820;
                  input = local_818;
                  if (pcVar24 != (char *)0x0) {
                    (*Curl_cfree)((local_828->state).aptr.userpwd);
                    (pCVar4->state).aptr.userpwd = pcVar24;
                    puVar1 = &(pCVar4->state).authhost.field_0x18;
                    *puVar1 = *puVar1 | 1;
                    pcVar16 = local_820;
                    input = local_818;
                  }
                }
              }
            }
          }
        }
        goto LAB_00135fc4;
      }
    }
    else {
LAB_001367bf:
      data_01 = (uchar *)0x0;
    }
    key = (uchar *)0x0;
    pcVar16 = local_820;
    goto LAB_00135fc4;
  }
LAB_00135fc2:
  data_00 = (uchar *)0x0;
  data_01 = (uchar *)0x0;
  key = (uchar *)0x0;
  pcVar16 = (char *)0x0;
LAB_00135fc4:
  Curl_dyn_free(&canonical_query);
  Curl_dyn_free(&canonical_path);
  Curl_dyn_free(&canonical_headers);
  Curl_dyn_free(&signed_headers);
  (*Curl_cfree)(input);
  (*Curl_cfree)(data_00);
  (*Curl_cfree)(pcVar16);
  (*Curl_cfree)(data_01);
  (*Curl_cfree)(key);
  (*Curl_cfree)(local_840);
  return local_844;
code_r0x001361bf:
  bVar31 = cVar5 != '\0';
  cVar5 = '\0';
  pcVar16 = pcVar17;
  if (bVar31) {
    cVar5 = ' ';
LAB_001361d1:
    *pcVar11 = cVar5;
    pcVar11 = pcVar11 + 1;
    cVar5 = *pcVar16;
  }
  goto LAB_00136199;
code_r0x001365d6:
  *psVar28 = (long)pcVar11 - (long)pcVar16;
  pcVar16 = pcVar11 + 1;
  lVar27 = lVar27 + 1;
  psVar28 = psVar28 + 2;
  if ((int)lVar27 == 0x40) goto LAB_00136662;
  goto LAB_001365c3;
LAB_00136662:
  Curl_failf(local_828,"aws-sigv4: too many query pairs in URL");
  local_844 = CURLE_URL_MALFORMAT;
LAB_00135fbc:
  input = (uchar *)0x0;
  goto LAB_00135fc2;
}

Assistant:

CURLcode Curl_output_aws_sigv4(struct Curl_easy *data, bool proxy)
{
  CURLcode result = CURLE_OUT_OF_MEMORY;
  struct connectdata *conn = data->conn;
  size_t len;
  const char *arg;
  char provider0[MAX_SIGV4_LEN + 1]="";
  char provider1[MAX_SIGV4_LEN + 1]="";
  char region[MAX_SIGV4_LEN + 1]="";
  char service[MAX_SIGV4_LEN + 1]="";
  bool sign_as_s3 = FALSE;
  const char *hostname = conn->host.name;
  time_t clock;
  struct tm tm;
  char timestamp[TIMESTAMP_SIZE];
  char date[9];
  struct dynbuf canonical_headers;
  struct dynbuf signed_headers;
  struct dynbuf canonical_query;
  struct dynbuf canonical_path;
  char *date_header = NULL;
  Curl_HttpReq httpreq;
  const char *method = NULL;
  char *payload_hash = NULL;
  size_t payload_hash_len = 0;
  unsigned char sha_hash[CURL_SHA256_DIGEST_LENGTH];
  char sha_hex[SHA256_HEX_LENGTH];
  char content_sha256_hdr[CONTENT_SHA256_HDR_LEN + 2] = ""; /* add \r\n */
  char *canonical_request = NULL;
  char *request_type = NULL;
  char *credential_scope = NULL;
  char *str_to_sign = NULL;
  const char *user = data->state.aptr.user ? data->state.aptr.user : "";
  char *secret = NULL;
  unsigned char sign0[CURL_SHA256_DIGEST_LENGTH] = {0};
  unsigned char sign1[CURL_SHA256_DIGEST_LENGTH] = {0};
  char *auth_headers = NULL;

  DEBUGASSERT(!proxy);
  (void)proxy;

  if(Curl_checkheaders(data, STRCONST("Authorization"))) {
    /* Authorization already present, Bailing out */
    return CURLE_OK;
  }

  /* we init those buffers here, so goto fail will free initialized dynbuf */
  Curl_dyn_init(&canonical_headers, CURL_MAX_HTTP_HEADER);
  Curl_dyn_init(&canonical_query, CURL_MAX_HTTP_HEADER);
  Curl_dyn_init(&signed_headers, CURL_MAX_HTTP_HEADER);
  Curl_dyn_init(&canonical_path, CURL_MAX_HTTP_HEADER);

  /*
   * Parameters parsing
   * Google and Outscale use the same OSC or GOOG,
   * but Amazon uses AWS and AMZ for header arguments.
   * AWS is the default because most of non-amazon providers
   * are still using aws:amz as a prefix.
   */
  arg = data->set.str[STRING_AWS_SIGV4] ?
    data->set.str[STRING_AWS_SIGV4] : "aws:amz";

  /* provider1[:provider2[:region[:service]]]

     No string can be longer than N bytes of non-whitespace
  */
  (void)sscanf(arg, "%" MAX_SIGV4_LEN_TXT "[^:]"
               ":%" MAX_SIGV4_LEN_TXT "[^:]"
               ":%" MAX_SIGV4_LEN_TXT "[^:]"
               ":%" MAX_SIGV4_LEN_TXT "s",
               provider0, provider1, region, service);
  if(!provider0[0]) {
    failf(data, "first aws-sigv4 provider cannot be empty");
    result = CURLE_BAD_FUNCTION_ARGUMENT;
    goto fail;
  }
  else if(!provider1[0])
    strcpy(provider1, provider0);

  if(!service[0]) {
    char *hostdot = strchr(hostname, '.');
    if(!hostdot) {
      failf(data, "aws-sigv4: service missing in parameters and hostname");
      result = CURLE_URL_MALFORMAT;
      goto fail;
    }
    len = hostdot - hostname;
    if(len > MAX_SIGV4_LEN) {
      failf(data, "aws-sigv4: service too long in hostname");
      result = CURLE_URL_MALFORMAT;
      goto fail;
    }
    memcpy(service, hostname, len);
    service[len] = '\0';

    infof(data, "aws_sigv4: picked service %s from host", service);

    if(!region[0]) {
      const char *reg = hostdot + 1;
      const char *hostreg = strchr(reg, '.');
      if(!hostreg) {
        failf(data, "aws-sigv4: region missing in parameters and hostname");
        result = CURLE_URL_MALFORMAT;
        goto fail;
      }
      len = hostreg - reg;
      if(len > MAX_SIGV4_LEN) {
        failf(data, "aws-sigv4: region too long in hostname");
        result = CURLE_URL_MALFORMAT;
        goto fail;
      }
      memcpy(region, reg, len);
      region[len] = '\0';
      infof(data, "aws_sigv4: picked region %s from host", region);
    }
  }

  Curl_http_method(data, conn, &method, &httpreq);

  /* AWS S3 requires a x-amz-content-sha256 header, and supports special
   * values like UNSIGNED-PAYLOAD */
  sign_as_s3 = (strcasecompare(provider0, "aws") &&
                strcasecompare(service, "s3"));

  payload_hash = parse_content_sha_hdr(data, provider1, &payload_hash_len);

  if(!payload_hash) {
    if(sign_as_s3)
      result = calc_s3_payload_hash(data, httpreq, provider1, sha_hash,
                                    sha_hex, content_sha256_hdr);
    else
      result = calc_payload_hash(data, sha_hash, sha_hex);
    if(result)
      goto fail;

    payload_hash = sha_hex;
    /* may be shorter than SHA256_HEX_LENGTH, like S3_UNSIGNED_PAYLOAD */
    payload_hash_len = strlen(sha_hex);
  }

#ifdef DEBUGBUILD
  {
    char *force_timestamp = getenv("CURL_FORCETIME");
    if(force_timestamp)
      clock = 0;
    else
      clock = time(NULL);
  }
#else
  clock = time(NULL);
#endif
  result = Curl_gmtime(clock, &tm);
  if(result) {
    goto fail;
  }
  if(!strftime(timestamp, sizeof(timestamp), "%Y%m%dT%H%M%SZ", &tm)) {
    result = CURLE_OUT_OF_MEMORY;
    goto fail;
  }

  result = make_headers(data, hostname, timestamp, provider1,
                        &date_header, content_sha256_hdr,
                        &canonical_headers, &signed_headers);
  if(result)
    goto fail;

  if(*content_sha256_hdr) {
    /* make_headers() needed this without the \r\n for canonicalization */
    size_t hdrlen = strlen(content_sha256_hdr);
    DEBUGASSERT(hdrlen + 3 < sizeof(content_sha256_hdr));
    memcpy(content_sha256_hdr + hdrlen, "\r\n", 3);
  }

  memcpy(date, timestamp, sizeof(date));
  date[sizeof(date) - 1] = 0;

  result = canon_query(data, data->state.up.query, &canonical_query);
  if(result)
    goto fail;

  result = canon_string(data->state.up.path, strlen(data->state.up.path),
                        &canonical_path, NULL);
  if(result)
    goto fail;
  result = CURLE_OUT_OF_MEMORY;

  canonical_request =
    aprintf("%s\n" /* HTTPRequestMethod */
            "%s\n" /* CanonicalURI */
            "%s\n" /* CanonicalQueryString */
            "%s\n" /* CanonicalHeaders */
            "%s\n" /* SignedHeaders */
            "%.*s",  /* HashedRequestPayload in hex */
            method,
            Curl_dyn_ptr(&canonical_path),
            Curl_dyn_ptr(&canonical_query) ?
            Curl_dyn_ptr(&canonical_query) : "",
            Curl_dyn_ptr(&canonical_headers),
            Curl_dyn_ptr(&signed_headers),
            (int)payload_hash_len, payload_hash);
  if(!canonical_request)
    goto fail;

  DEBUGF(infof(data, "Canonical request: %s", canonical_request));

  /* provider 0 lowercase */
  Curl_strntolower(provider0, provider0, strlen(provider0));
  request_type = aprintf("%s4_request", provider0);
  if(!request_type)
    goto fail;

  credential_scope = aprintf("%s/%s/%s/%s",
                             date, region, service, request_type);
  if(!credential_scope)
    goto fail;

  if(Curl_sha256it(sha_hash, (unsigned char *) canonical_request,
                   strlen(canonical_request)))
    goto fail;

  sha256_to_hex(sha_hex, sha_hash);

  /* provider 0 uppercase */
  Curl_strntoupper(provider0, provider0, strlen(provider0));

  /*
   * Google allows using RSA key instead of HMAC, so this code might change
   * in the future. For now we only support HMAC.
   */
  str_to_sign = aprintf("%s4-HMAC-SHA256\n" /* Algorithm */
                        "%s\n" /* RequestDateTime */
                        "%s\n" /* CredentialScope */
                        "%s",  /* HashedCanonicalRequest in hex */
                        provider0,
                        timestamp,
                        credential_scope,
                        sha_hex);
  if(!str_to_sign) {
    goto fail;
  }

  /* provider 0 uppercase */
  secret = aprintf("%s4%s", provider0,
                   data->state.aptr.passwd ?
                   data->state.aptr.passwd : "");
  if(!secret)
    goto fail;

  HMAC_SHA256(secret, strlen(secret), date, strlen(date), sign0);
  HMAC_SHA256(sign0, sizeof(sign0), region, strlen(region), sign1);
  HMAC_SHA256(sign1, sizeof(sign1), service, strlen(service), sign0);
  HMAC_SHA256(sign0, sizeof(sign0), request_type, strlen(request_type), sign1);
  HMAC_SHA256(sign1, sizeof(sign1), str_to_sign, strlen(str_to_sign), sign0);

  sha256_to_hex(sha_hex, sign0);

  /* provider 0 uppercase */
  auth_headers = aprintf("Authorization: %s4-HMAC-SHA256 "
                         "Credential=%s/%s, "
                         "SignedHeaders=%s, "
                         "Signature=%s\r\n"
                         /*
                          * date_header is added here, only if it was not
                          * user-specified (using CURLOPT_HTTPHEADER).
                          * date_header includes \r\n
                          */
                         "%s"
                         "%s", /* optional sha256 header includes \r\n */
                         provider0,
                         user,
                         credential_scope,
                         Curl_dyn_ptr(&signed_headers),
                         sha_hex,
                         date_header ? date_header : "",
                         content_sha256_hdr);
  if(!auth_headers) {
    goto fail;
  }

  Curl_safefree(data->state.aptr.userpwd);
  data->state.aptr.userpwd = auth_headers;
  data->state.authhost.done = TRUE;
  result = CURLE_OK;

fail:
  Curl_dyn_free(&canonical_query);
  Curl_dyn_free(&canonical_path);
  Curl_dyn_free(&canonical_headers);
  Curl_dyn_free(&signed_headers);
  free(canonical_request);
  free(request_type);
  free(credential_scope);
  free(str_to_sign);
  free(secret);
  free(date_header);
  return result;
}